

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::~IfcElementAssembly(IfcElementAssembly *this)

{
  undefined1 *puVar1;
  IfcElement *this_00;
  long *plVar2;
  long lVar3;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject + -0x18);
  this_00 = (IfcElement *)
            (&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x0 + lVar3);
  plVar2 = (long *)((this->PredefinedType).field_2._M_local_buf + lVar3);
  plVar2[-0x30] = 0x8f6cd8;
  plVar2[2] = 0x8f6dc8;
  plVar2[-0x1f] = 0x8f6d00;
  plVar2[-0x1d] = 0x8f6d28;
  plVar2[-0x16] = 0x8f6d50;
  plVar2[-0x10] = 0x8f6d78;
  plVar2[-9] = 0x8f6da0;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  puVar1 = &this_00[1].super_IfcProduct.super_IfcObject.field_0x8;
  if (*(undefined1 **)&this_00->field_0x148 != puVar1) {
    operator_delete(*(undefined1 **)&this_00->field_0x148,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__008f6de0);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}